

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmlinuxalsa.c
# Opt level: O3

PmError pm_linuxalsa_init(void)

{
  PmError PVar1;
  int iVar2;
  undefined4 uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  size_t sVar7;
  char *pcVar8;
  void *__s;
  void *__s_00;
  undefined8 uStack_40;
  void *local_38;
  
  uStack_40 = 0x104be7;
  PVar1 = snd_seq_open(&seq,"default",3,0);
  if (~pmNoData < PVar1) {
    uStack_40 = 0x104bf4;
    lVar6 = snd_seq_client_info_sizeof();
    lVar6 = -(lVar6 + 0xfU & 0xfffffffffffffff0);
    __s = (void *)((long)&local_38 + lVar6);
    *(undefined8 *)((long)&uStack_40 + lVar6) = 0x104c0a;
    sVar7 = snd_seq_client_info_sizeof();
    *(undefined8 *)((long)&uStack_40 + lVar6) = 0x104c17;
    memset(__s,0,sVar7);
    *(undefined8 *)((long)&uStack_40 + lVar6) = 0x104c1c;
    lVar6 = snd_seq_port_info_sizeof();
    __s_00 = (void *)((long)__s - (lVar6 + 0xfU & 0xfffffffffffffff0));
    *(undefined8 *)((long)__s_00 + -8) = 0x104c32;
    sVar7 = snd_seq_port_info_sizeof();
    *(undefined8 *)((long)__s_00 + -8) = 0x104c3f;
    memset(__s_00,0,sVar7);
    *(undefined8 *)((long)__s_00 + -8) = 0x104c4c;
    snd_seq_client_info_set_client(__s,0xffffffff);
    *(undefined8 *)((long)__s_00 + -8) = 0x104c5b;
    iVar2 = snd_seq_query_next_client(seq,__s);
    PVar1 = pmNoData;
    local_38 = __s;
    if (iVar2 == 0) {
      do {
        *(undefined8 *)((long)__s_00 + -8) = 0x104c76;
        uVar3 = snd_seq_client_info_get_client(__s);
        *(undefined8 *)((long)__s_00 + -8) = 0x104c80;
        snd_seq_port_info_set_client(__s_00,uVar3);
        *(undefined8 *)((long)__s_00 + -8) = 0x104c8d;
        snd_seq_port_info_set_port(__s_00,0xffffffff);
        while( true ) {
          *(undefined8 *)((long)__s_00 + -8) = 0x104c9c;
          iVar2 = snd_seq_query_next_port(seq,__s_00);
          __s = local_38;
          if (iVar2 != 0) break;
          *(undefined8 *)((long)__s_00 + -8) = 0x104cac;
          iVar2 = snd_seq_port_info_get_client(__s_00);
          if (iVar2 != 0) {
            *(undefined8 *)((long)__s_00 + -8) = 0x104cb8;
            uVar4 = snd_seq_port_info_get_capability(__s_00);
            if ((uVar4 & 0x60) != 0) {
              if ((uVar4 & 0x40) != 0) {
                if (pm_default_output_device_id == -1) {
                  pm_default_output_device_id = pm_descriptor_index;
                }
                *(undefined8 *)((long)__s_00 + -8) = 0x104ced;
                pcVar8 = (char *)snd_seq_port_info_get_name(__s_00);
                *(undefined8 *)((long)__s_00 + -8) = 0x104cf5;
                pcVar8 = pm_strdup(pcVar8);
                *(undefined8 *)((long)__s_00 + -8) = 0x104d00;
                iVar2 = snd_seq_port_info_get_client(__s_00);
                *(undefined8 *)((long)__s_00 + -8) = 0x104d0f;
                iVar5 = snd_seq_port_info_get_port(__s_00);
                *(undefined8 *)((long)__s_00 + -8) = 0x104d29;
                pm_add_device("ALSA",pcVar8,0,(void *)((long)iVar5 | (long)iVar2 << 8),
                              &pm_linuxalsa_out_dictionary);
              }
              if ((uVar4 & 0x20) != 0) {
                if (pm_default_input_device_id == -1) {
                  pm_default_input_device_id = pm_descriptor_index;
                }
                *(undefined8 *)((long)__s_00 + -8) = 0x104d59;
                pcVar8 = (char *)snd_seq_port_info_get_name(__s_00);
                *(undefined8 *)((long)__s_00 + -8) = 0x104d61;
                pcVar8 = pm_strdup(pcVar8);
                *(undefined8 *)((long)__s_00 + -8) = 0x104d6c;
                iVar2 = snd_seq_port_info_get_client(__s_00);
                *(undefined8 *)((long)__s_00 + -8) = 0x104d7b;
                iVar5 = snd_seq_port_info_get_port(__s_00);
                *(undefined8 *)((long)__s_00 + -8) = 0x104d98;
                pm_add_device("ALSA",pcVar8,1,(void *)((long)iVar5 | (long)iVar2 << 8),
                              &pm_linuxalsa_in_dictionary);
              }
            }
          }
        }
        *(undefined8 *)((long)__s_00 + -8) = 0x104db0;
        iVar2 = snd_seq_query_next_client(seq,__s);
      } while (iVar2 == 0);
      PVar1 = pmNoData;
    }
  }
  return PVar1;
}

Assistant:

PmError pm_linuxalsa_init( void )
{
    int  err;
    snd_seq_client_info_t *cinfo;
    snd_seq_port_info_t *pinfo;
    unsigned int caps;

    /* Previously, the last parameter was SND_SEQ_NONBLOCK, but this 
     * would cause messages to be dropped if the ALSA buffer fills up.
     * The correct behavior is for writes to block until there is 
     * room to send all the data. The client should normally allocate
     * a large enough buffer to avoid blocking on output. 
     * Now that blocking is enabled, the seq_event_input() will block
     * if there is no input data. This is not what we want, so must
     * call seq_event_input_pending() to avoid blocking.
     */
    err = snd_seq_open(&seq, "default", SND_SEQ_OPEN_DUPLEX, 0);
    if (err < 0) return err;
    
    snd_seq_client_info_alloca(&cinfo);
    snd_seq_port_info_alloca(&pinfo);

    snd_seq_client_info_set_client(cinfo, -1);
    while (snd_seq_query_next_client(seq, cinfo) == 0) {
        snd_seq_port_info_set_client(pinfo, snd_seq_client_info_get_client(cinfo));
        snd_seq_port_info_set_port(pinfo, -1);
        while (snd_seq_query_next_port(seq, pinfo) == 0) {
            if (snd_seq_port_info_get_client(pinfo) == SND_SEQ_CLIENT_SYSTEM)
                continue; /* ignore Timer and Announce ports on client 0 */
            caps = snd_seq_port_info_get_capability(pinfo);
            if (!(caps & (SND_SEQ_PORT_CAP_SUBS_READ | SND_SEQ_PORT_CAP_SUBS_WRITE)))
                continue; /* ignore if you cannot read or write port */
            if (caps & SND_SEQ_PORT_CAP_SUBS_WRITE) {
                if (pm_default_output_device_id == -1)
                    pm_default_output_device_id = pm_descriptor_index;
                pm_add_device("ALSA",
                              pm_strdup(snd_seq_port_info_get_name(pinfo)),
                              FALSE,
                              MAKE_DESCRIPTOR((uintptr_t)snd_seq_port_info_get_client(pinfo),
                                              snd_seq_port_info_get_port(pinfo)),
                              &pm_linuxalsa_out_dictionary);
            }
            if (caps & SND_SEQ_PORT_CAP_SUBS_READ) {
                if (pm_default_input_device_id == -1)
                    pm_default_input_device_id = pm_descriptor_index;
                pm_add_device("ALSA",
                              pm_strdup(snd_seq_port_info_get_name(pinfo)),
                              TRUE,
                              MAKE_DESCRIPTOR((uintptr_t)snd_seq_port_info_get_client(pinfo),
                                              snd_seq_port_info_get_port(pinfo)),
                              &pm_linuxalsa_in_dictionary);
            }
        }
    }
    return pmNoError;
}